

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void on_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  uv_timer_t *puVar8;
  int extraout_EDX;
  char *pcVar9;
  char *pcVar10;
  ulong unaff_RBP;
  uv_process_t *puVar11;
  uv_timer_t *puVar12;
  code *pcVar13;
  uv_process_options_t *unaff_R14;
  undefined8 unaff_R15;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iStack_e74;
  undefined1 auStack_e70 [16];
  uv_stdio_container_t uStack_e60;
  undefined4 uStack_e50;
  undefined4 uStack_e48;
  undefined4 uStack_e40;
  undefined4 uStack_e38;
  undefined4 uStack_e30;
  int iStack_e28;
  code *pcStack_e20;
  undefined1 auStack_e18 [240];
  code *pcStack_d28;
  uv_stdio_container_t uStack_d20;
  undefined4 uStack_d10;
  undefined4 uStack_d00;
  undefined4 uStack_cf0;
  undefined1 *puStack_ce8;
  undefined1 auStack_cd8 [264];
  undefined1 *puStack_bd0;
  anon_union_8_2_26168aa3_for_data aStack_bc8;
  code *pcStack_bc0;
  code *pcStack_bb8;
  char acStack_bb0 [32];
  undefined1 *puStack_b90;
  undefined8 uStack_b88;
  uv_stdio_container_t uStack_b80;
  undefined4 uStack_b70;
  undefined1 *puStack_b68;
  undefined1 auStack_b60 [264];
  undefined1 auStack_a58 [264];
  undefined1 auStack_950 [192];
  char *pcStack_890;
  uv_process_options_t *puStack_888;
  code *pcStack_880;
  undefined8 uStack_878;
  undefined1 auStack_870 [16];
  uv_process_options_t auStack_860 [6];
  uv_stdio_container_t uStack_6a8;
  undefined4 uStack_698;
  uint uStack_690;
  undefined4 uStack_688;
  uint uStack_680;
  char *pcStack_670;
  uv_process_options_t *puStack_668;
  undefined1 auStack_640 [16];
  uv_stdio_container_t uStack_630;
  undefined4 uStack_620;
  uint uStack_618;
  undefined4 uStack_610;
  uint uStack_608;
  uv_process_options_t auStack_5f8 [6];
  char *pcStack_440;
  uv_process_options_t *puStack_438;
  undefined1 auStack_418 [16];
  uv_stdio_container_t uStack_408;
  undefined4 uStack_3f8;
  uint uStack_3f0;
  undefined4 uStack_3e8;
  uint uStack_3e0;
  uv_process_options_t auStack_3d8 [6];
  char *pcStack_220;
  uv_process_options_t *puStack_218;
  undefined8 uStack_210;
  undefined1 auStack_200 [16];
  uv_stdio_container_t uStack_1f0;
  undefined4 uStack_1e0;
  uint uStack_1d8;
  uv_process_options_t auStack_1d0 [6];
  
  if (0 < nread) {
    output_used = output_used + (int)nread;
    return;
  }
  if (-1 < nread) {
    return;
  }
  if (nread == -0xfff) {
    uv_close(tcp,close_cb);
    return;
  }
  on_read_cold_1();
  pcVar9 = "stdout_file";
  puStack_218 = (uv_process_options_t *)0x16c709;
  unlink("stdout_file");
  puStack_218 = (uv_process_options_t *)0x16c71c;
  init_process_options("spawn_helper2",exit_cb);
  puStack_218 = (uv_process_options_t *)0x16c739;
  uVar1 = uv_fs_open(0,auStack_1d0,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    puStack_218 = (uv_process_options_t *)0x16c8c8;
    run_test_spawn_stdout_to_file_cold_9();
LAB_0016c8c8:
    puStack_218 = (uv_process_options_t *)0x16c8cd;
    run_test_spawn_stdout_to_file_cold_1();
LAB_0016c8cd:
    puStack_218 = (uv_process_options_t *)0x16c8d2;
    run_test_spawn_stdout_to_file_cold_2();
LAB_0016c8d2:
    puStack_218 = (uv_process_options_t *)0x16c8d7;
    run_test_spawn_stdout_to_file_cold_3();
LAB_0016c8d7:
    puStack_218 = (uv_process_options_t *)0x16c8dc;
    run_test_spawn_stdout_to_file_cold_4();
LAB_0016c8dc:
    puStack_218 = (uv_process_options_t *)0x16c8e1;
    run_test_spawn_stdout_to_file_cold_5();
LAB_0016c8e1:
    puStack_218 = (uv_process_options_t *)0x16c8e6;
    run_test_spawn_stdout_to_file_cold_6();
LAB_0016c8e6:
    puStack_218 = (uv_process_options_t *)0x16c8eb;
    run_test_spawn_stdout_to_file_cold_7();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    puStack_218 = (uv_process_options_t *)0x16c74e;
    uv_fs_req_cleanup(auStack_1d0);
    options.stdio = &uStack_1f0;
    unaff_R14 = &options;
    uStack_1f0.flags = UV_IGNORE;
    uStack_1e0 = 2;
    options.stdio_count = 2;
    puStack_218 = (uv_process_options_t *)0x16c77d;
    uStack_1d8 = uVar1;
    uVar5 = uv_default_loop();
    puStack_218 = (uv_process_options_t *)0x16c78f;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016c8c8;
    puStack_218 = (uv_process_options_t *)0x16c79c;
    uVar5 = uv_default_loop();
    puStack_218 = (uv_process_options_t *)0x16c7a6;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016c8cd;
    if (exit_cb_called != 1) goto LAB_0016c8d2;
    if (close_cb_called != 1) goto LAB_0016c8d7;
    puStack_218 = (uv_process_options_t *)0x16c7d9;
    auStack_200 = uv_buf_init(output,0x400);
    uStack_210 = 0;
    puStack_218 = (uv_process_options_t *)0x16c804;
    iVar2 = uv_fs_read(0,auStack_1d0,uVar1,auStack_200,1,0);
    if (iVar2 != 0xc) goto LAB_0016c8dc;
    unaff_R14 = auStack_1d0;
    puStack_218 = (uv_process_options_t *)0x16c81a;
    uv_fs_req_cleanup(unaff_R14);
    puStack_218 = (uv_process_options_t *)0x16c828;
    iVar2 = uv_fs_close(0,unaff_R14,pcVar9,0);
    if (iVar2 != 0) goto LAB_0016c8e1;
    puStack_218 = (uv_process_options_t *)0x16c83a;
    uv_fs_req_cleanup(auStack_1d0);
    puStack_218 = (uv_process_options_t *)0x16c84f;
    printf("output is: %s",output);
    if (CONCAT17(output[0xc],
                 CONCAT16(output[0xb],
                          CONCAT15(output[10],
                                   CONCAT14(output[9],
                                            CONCAT13(output[8],
                                                     CONCAT12(output[7],
                                                              CONCAT11(output[6],output[5]))))))) !=
        0xa646c726f7720 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016c8e6;
    puStack_218 = (uv_process_options_t *)0x16c882;
    unlink("stdout_file");
    puStack_218 = (uv_process_options_t *)0x16c887;
    pcVar9 = (char *)uv_default_loop();
    puStack_218 = (uv_process_options_t *)0x16c89b;
    uv_walk(pcVar9,close_walk_cb,0);
    puStack_218 = (uv_process_options_t *)0x16c8a5;
    uv_run(pcVar9,0);
    puStack_218 = (uv_process_options_t *)0x16c8aa;
    uVar5 = uv_default_loop();
    puStack_218 = (uv_process_options_t *)0x16c8b2;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  puStack_218 = (uv_process_options_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_8();
  pcVar10 = "stdout_file";
  pcStack_220 = pcVar9;
  puStack_218 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,auStack_3d8,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file_cold_9();
LAB_0016cada:
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_0016cadf:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_0016cae4:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_0016cae9:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_0016caee:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_0016caf3:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_0016caf8:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(auStack_3d8);
    options.stdio = &uStack_408;
    unaff_R14 = &options;
    uStack_408.flags = UV_IGNORE;
    uStack_3f8 = 2;
    uStack_3e8 = 2;
    options.stdio_count = 3;
    uStack_3f0 = uVar1;
    uStack_3e0 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016cada;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016cadf;
    if (exit_cb_called != 1) goto LAB_0016cae4;
    if (close_cb_called != 1) goto LAB_0016cae9;
    auStack_418 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,auStack_3d8,pcVar10,auStack_418,1,0);
    if (iVar2 != 0x1b) goto LAB_0016caee;
    unaff_R14 = auStack_3d8;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_0016caf3;
    uv_fs_req_cleanup(auStack_3d8);
    printf("output is: %s",output);
    auVar16[0] = -(output[0xc] == 'h');
    auVar16[1] = -(output[0xd] == 'e');
    auVar16[2] = -(output[0xe] == 'l');
    auVar16[3] = -(output[0xf] == 'l');
    auVar16[4] = -(output[0x10] == 'o');
    auVar16[5] = -(output[0x11] == ' ');
    auVar16[6] = -(output[0x12] == 'e');
    auVar16[7] = -(output[0x13] == 'r');
    auVar16[8] = -(output[0x14] == 'r');
    auVar16[9] = -(output[0x15] == 'w');
    auVar16[10] = -(output[0x16] == 'o');
    auVar16[0xb] = -(output[0x17] == 'r');
    auVar16[0xc] = -(output[0x18] == 'l');
    auVar16[0xd] = -(output[0x19] == 'd');
    auVar16[0xe] = -(output[0x1a] == '\n');
    auVar16[0xf] = -(output[0x1b] == '\0');
    auVar14[0] = -(output[0] == 'h');
    auVar14[1] = -(output[1] == 'e');
    auVar14[2] = -(output[2] == 'l');
    auVar14[3] = -(output[3] == 'l');
    auVar14[4] = -(output[4] == 'o');
    auVar14[5] = -(output[5] == ' ');
    auVar14[6] = -(output[6] == 'w');
    auVar14[7] = -(output[7] == 'o');
    auVar14[8] = -(output[8] == 'r');
    auVar14[9] = -(output[9] == 'l');
    auVar14[10] = -(output[10] == 'd');
    auVar14[0xb] = -(output[0xb] == '\n');
    auVar14[0xc] = -(output[0xc] == 'h');
    auVar14[0xd] = -(output[0xd] == 'e');
    auVar14[0xe] = -(output[0xe] == 'l');
    auVar14[0xf] = -(output[0xf] == 'l');
    auVar14 = auVar14 & auVar16;
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016caf8;
    unlink("stdout_file");
    pcVar10 = (char *)uv_default_loop();
    uv_walk(pcVar10,close_walk_cb,0);
    uv_run(pcVar10,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_8();
  pcVar9 = "stdout_file";
  pcStack_440 = pcVar10;
  puStack_438 = unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  uVar1 = uv_fs_open(0,auStack_5f8,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_0016cd05:
    run_test_spawn_stdout_and_stderr_to_file2_cold_9();
LAB_0016cd0a:
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_0016cd0f:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_0016cd14:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_0016cd19:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_0016cd1e:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_0016cd23:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_0016cd28:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
  }
  else {
    pcVar9 = (char *)(ulong)uVar1;
    uv_fs_req_cleanup(auStack_5f8);
    unaff_RBP = 2;
    uVar1 = dup2(uVar1,2);
    if (uVar1 == 0xffffffff) goto LAB_0016cd05;
    pcVar9 = (char *)(ulong)uVar1;
    options.stdio = &uStack_630;
    unaff_R14 = &options;
    uStack_630.flags = UV_IGNORE;
    uStack_620 = 2;
    uStack_610 = 2;
    options.stdio_count = 3;
    uStack_618 = uVar1;
    uStack_608 = uVar1;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016cd0a;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016cd0f;
    if (exit_cb_called != 1) goto LAB_0016cd14;
    if (close_cb_called != 1) goto LAB_0016cd19;
    auStack_640 = uv_buf_init(output,0x400);
    iVar2 = uv_fs_read(0,auStack_5f8,pcVar9,auStack_640,1,0);
    if (iVar2 != 0x1b) goto LAB_0016cd1e;
    unaff_R14 = auStack_5f8;
    uv_fs_req_cleanup(unaff_R14);
    iVar2 = uv_fs_close(0,unaff_R14,uVar1,0);
    if (iVar2 != 0) goto LAB_0016cd23;
    uv_fs_req_cleanup(auStack_5f8);
    printf("output is: %s",output);
    auVar17[0] = -(output[0xc] == 'h');
    auVar17[1] = -(output[0xd] == 'e');
    auVar17[2] = -(output[0xe] == 'l');
    auVar17[3] = -(output[0xf] == 'l');
    auVar17[4] = -(output[0x10] == 'o');
    auVar17[5] = -(output[0x11] == ' ');
    auVar17[6] = -(output[0x12] == 'e');
    auVar17[7] = -(output[0x13] == 'r');
    auVar17[8] = -(output[0x14] == 'r');
    auVar17[9] = -(output[0x15] == 'w');
    auVar17[10] = -(output[0x16] == 'o');
    auVar17[0xb] = -(output[0x17] == 'r');
    auVar17[0xc] = -(output[0x18] == 'l');
    auVar17[0xd] = -(output[0x19] == 'd');
    auVar17[0xe] = -(output[0x1a] == '\n');
    auVar17[0xf] = -(output[0x1b] == '\0');
    auVar15[0] = -(output[0] == 'h');
    auVar15[1] = -(output[1] == 'e');
    auVar15[2] = -(output[2] == 'l');
    auVar15[3] = -(output[3] == 'l');
    auVar15[4] = -(output[4] == 'o');
    auVar15[5] = -(output[5] == ' ');
    auVar15[6] = -(output[6] == 'w');
    auVar15[7] = -(output[7] == 'o');
    auVar15[8] = -(output[8] == 'r');
    auVar15[9] = -(output[9] == 'l');
    auVar15[10] = -(output[10] == 'd');
    auVar15[0xb] = -(output[0xb] == '\n');
    auVar15[0xc] = -(output[0xc] == 'h');
    auVar15[0xd] = -(output[0xd] == 'e');
    auVar15[0xe] = -(output[0xe] == 'l');
    auVar15[0xf] = -(output[0xf] == 'l');
    auVar15 = auVar15 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016cd28;
    unlink("stdout_file");
    pcVar9 = (char *)uv_default_loop();
    uv_walk(pcVar9,close_walk_cb,0);
    uv_run(pcVar9,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  pcVar10 = "stdout_file";
  pcStack_880 = (code *)0x16cd4e;
  pcStack_670 = pcVar9;
  puStack_668 = unaff_R14;
  unlink("stdout_file");
  pcStack_880 = (code *)0x16cd5a;
  unlink("stderr_file");
  pcStack_880 = (code *)0x16cd6d;
  init_process_options("spawn_helper6",exit_cb);
  pcStack_880 = (code *)0x16cd8a;
  uVar1 = uv_fs_open(0,auStack_860,"stdout_file",0x42,0x180,0);
  if (uVar1 == 0xffffffff) {
    pcStack_880 = (code *)0x16d036;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_0016d036:
    pcStack_880 = (code *)0x16d03b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_0016d03b:
    pcStack_880 = (code *)0x16d040;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_0016d040:
    pcStack_880 = (code *)0x16d045;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_0016d045:
    pcStack_880 = (code *)0x16d04a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_0016d04a:
    pcStack_880 = (code *)0x16d04f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_0016d04f:
    pcStack_880 = (code *)0x16d054;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_0016d054:
    pcStack_880 = (code *)0x16d059;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_0016d059:
    pcStack_880 = (code *)0x16d05e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_0016d05e:
    pcStack_880 = (code *)0x16d063;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
LAB_0016d063:
    pcStack_880 = (code *)0x16d068;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_0016d068:
    pcStack_880 = (code *)0x16d06d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_0016d06d:
    pcStack_880 = (code *)0x16d072;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_0016d072:
    pcStack_880 = (code *)0x16d077;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  else {
    pcVar10 = (char *)(ulong)uVar1;
    pcStack_880 = (code *)0x16cd9f;
    uv_fs_req_cleanup(auStack_860);
    pcStack_880 = (code *)0x16cdab;
    uVar1 = dup2(uVar1,1);
    if (uVar1 == 0xffffffff) goto LAB_0016d036;
    unaff_RBP = (ulong)uVar1;
    pcStack_880 = (code *)0x16cdd7;
    uVar3 = uv_fs_open(0,auStack_860,"stderr_file",0x42,0x180,0);
    if (uVar3 == 0xffffffff) goto LAB_0016d03b;
    pcVar10 = (char *)(ulong)uVar3;
    pcStack_880 = (code *)0x16cdec;
    uv_fs_req_cleanup(auStack_860);
    unaff_R15 = 2;
    pcStack_880 = (code *)0x16cdfe;
    uVar3 = dup2(uVar3,2);
    if (uVar3 == 0xffffffff) goto LAB_0016d040;
    pcVar10 = (char *)(ulong)uVar3;
    options.stdio = &uStack_6a8;
    unaff_R14 = &options;
    uStack_6a8.flags = UV_IGNORE;
    uStack_698 = 2;
    uStack_688 = 2;
    options.stdio_count = 3;
    pcStack_880 = (code *)0x16ce42;
    uStack_690 = uVar3;
    uStack_680 = uVar1;
    uVar5 = uv_default_loop();
    pcStack_880 = (code *)0x16ce54;
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016d045;
    pcStack_880 = (code *)0x16ce61;
    uVar5 = uv_default_loop();
    pcStack_880 = (code *)0x16ce6b;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d04a;
    if (exit_cb_called != 1) goto LAB_0016d04f;
    if (close_cb_called != 1) goto LAB_0016d054;
    pcStack_880 = (code *)0x16ce9e;
    auStack_870 = uv_buf_init(output,0x400);
    uStack_878 = 0;
    pcStack_880 = (code *)0x16cec9;
    iVar2 = uv_fs_read(0,auStack_860,uVar1,auStack_870,1,0);
    if (iVar2 < 0xf) goto LAB_0016d059;
    unaff_R14 = auStack_860;
    pcStack_880 = (code *)0x16cedf;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_880 = (code *)0x16ceed;
    iVar2 = uv_fs_close(0,unaff_R14,unaff_RBP,0);
    if (iVar2 != 0) goto LAB_0016d05e;
    pcStack_880 = (code *)0x16ceff;
    uv_fs_req_cleanup(auStack_860);
    pcStack_880 = (code *)0x16cf14;
    printf("output is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa646c726f777272 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7265206f6c6c6568) goto LAB_0016d063;
    uStack_878 = 0;
    pcStack_880 = (code *)0x16cf63;
    iVar2 = uv_fs_read(0,auStack_860,uVar3,auStack_870,1,0);
    if (iVar2 < 0xc) goto LAB_0016d068;
    unaff_R14 = auStack_860;
    pcStack_880 = (code *)0x16cf79;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_880 = (code *)0x16cf87;
    iVar2 = uv_fs_close(0,unaff_R14,pcVar10,0);
    if (iVar2 != 0) goto LAB_0016d06d;
    pcStack_880 = (code *)0x16cf99;
    uv_fs_req_cleanup(auStack_860);
    pcStack_880 = (code *)0x16cfae;
    printf("output is: %s",output);
    if (CONCAT13(output[0xb],CONCAT12(output[10],CONCAT11(output[9],output[8]))) != 0xa646c72 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x6f77206f6c6c6568) goto LAB_0016d072;
    pcStack_880 = (code *)0x16cfe1;
    unlink("stdout_file");
    pcStack_880 = (code *)0x16cfed;
    unlink("stderr_file");
    pcStack_880 = (code *)0x16cff2;
    pcVar10 = (char *)uv_default_loop();
    pcStack_880 = (code *)0x16d006;
    uv_walk(pcVar10,close_walk_cb,0);
    pcStack_880 = (code *)0x16d010;
    uv_run(pcVar10,0);
    pcStack_880 = (code *)0x16d015;
    uVar5 = uv_default_loop();
    pcStack_880 = (code *)0x16d01d;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  pcStack_880 = run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  pcVar9 = acStack_bb0;
  builtin_strncpy(acStack_bb0,"hello-from-spawn_stdin",0x17);
  pcStack_bb8 = (code *)0x16d0b5;
  pcStack_890 = pcVar10;
  puStack_888 = unaff_R14;
  pcStack_880 = (code *)unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  pcStack_bb8 = (code *)0x16d0ba;
  uVar5 = uv_default_loop();
  puVar7 = auStack_a58;
  pcStack_bb8 = (code *)0x16d0cf;
  uv_pipe_init(uVar5,puVar7,0);
  pcStack_bb8 = (code *)0x16d0d4;
  uVar5 = uv_default_loop();
  pcStack_bb8 = (code *)0x16d0e6;
  uv_pipe_init(uVar5,(uv_stream_t *)auStack_b60,0);
  options.stdio = &uStack_b80;
  uStack_b80.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStack_b70 = 0x21;
  options.stdio_count = 2;
  pcStack_bb8 = (code *)0x16d11d;
  uStack_b80.data.stream = (uv_stream_t *)auStack_b60;
  puStack_b68 = puVar7;
  puVar6 = (undefined1 *)uv_default_loop();
  iVar2 = 0x31aa10;
  pcStack_bb8 = (code *)0x16d12f;
  iVar4 = uv_spawn(puVar6,&process,&options);
  if (iVar4 == 0) {
    uStack_b88 = 0x17;
    puVar6 = auStack_950;
    iVar2 = (int)auStack_b60;
    pcStack_bb8 = (code *)0x16d168;
    puStack_b90 = acStack_bb0;
    iVar4 = uv_write();
    if (iVar4 != 0) goto LAB_0016d213;
    iVar2 = 0x16c6a5;
    puVar6 = auStack_a58;
    pcStack_bb8 = (code *)0x16d18b;
    iVar4 = uv_read_start(puVar6,on_alloc,on_read);
    if (iVar4 != 0) goto LAB_0016d218;
    pcStack_bb8 = (code *)0x16d198;
    puVar6 = (undefined1 *)uv_default_loop();
    iVar2 = 0;
    pcStack_bb8 = (code *)0x16d1a2;
    iVar4 = uv_run();
    if (iVar4 != 0) goto LAB_0016d21d;
    if (exit_cb_called != 1) goto LAB_0016d222;
    if (close_cb_called != 3) goto LAB_0016d227;
    iVar2 = 0x31aaa0;
    pcStack_bb8 = (code *)0x16d1c7;
    iVar4 = strcmp(acStack_bb0,output);
    if (iVar4 != 0) goto LAB_0016d22c;
    pcStack_bb8 = (code *)0x16d1d0;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_bb8 = (code *)0x16d1e4;
    uv_walk(puVar7,close_walk_cb,0);
    iVar2 = 0;
    pcStack_bb8 = (code *)0x16d1ee;
    uv_run(puVar7);
    pcStack_bb8 = (code *)0x16d1f3;
    pcVar9 = (char *)uv_default_loop();
    pcStack_bb8 = (code *)0x16d1fb;
    iVar4 = uv_loop_close();
    if (iVar4 == 0) {
      return;
    }
  }
  else {
    pcStack_bb8 = (code *)0x16d213;
    run_test_spawn_stdin_cold_1();
LAB_0016d213:
    pcStack_bb8 = (code *)0x16d218;
    run_test_spawn_stdin_cold_2();
LAB_0016d218:
    pcStack_bb8 = (code *)0x16d21d;
    run_test_spawn_stdin_cold_3();
LAB_0016d21d:
    pcStack_bb8 = (code *)0x16d222;
    run_test_spawn_stdin_cold_4();
LAB_0016d222:
    pcStack_bb8 = (code *)0x16d227;
    run_test_spawn_stdin_cold_5();
LAB_0016d227:
    pcVar9 = puVar6;
    pcStack_bb8 = (code *)0x16d22c;
    run_test_spawn_stdin_cold_6();
LAB_0016d22c:
    pcStack_bb8 = (code *)0x16d231;
    run_test_spawn_stdin_cold_7();
  }
  pcStack_bb8 = write_cb;
  run_test_spawn_stdin_cold_8();
  if (iVar2 == 0) {
    uv_close(*(undefined8 *)(pcVar9 + 0x50),close_cb);
    return;
  }
  pcStack_bc0 = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  pcStack_d28 = (code *)0x16d26e;
  puStack_bd0 = puVar7;
  aStack_bc8.stream = (uv_stream_t *)auStack_b60;
  pcStack_bc0 = (code *)unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  pcStack_d28 = (code *)0x16d273;
  uVar5 = uv_default_loop();
  puVar7 = auStack_cd8;
  pcStack_d28 = (code *)0x16d287;
  uv_pipe_init(uVar5,puVar7,0);
  uStack_d20.flags = UV_IGNORE;
  uStack_d10 = 0;
  uStack_d00 = 0;
  uStack_cf0 = 0x21;
  options.stdio_count = 4;
  pcStack_d28 = (code *)0x16d2ba;
  options.stdio = &uStack_d20;
  puStack_ce8 = puVar7;
  uVar5 = uv_default_loop();
  pcStack_d28 = (code *)0x16d2cc;
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    pcStack_d28 = (code *)0x16d2ec;
    iVar2 = uv_read_start(auStack_cd8,on_alloc,on_read);
    if (iVar2 != 0) goto LAB_0016d3a8;
    pcStack_d28 = (code *)0x16d2f9;
    uVar5 = uv_default_loop();
    pcStack_d28 = (code *)0x16d303;
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d3ad;
    if (exit_cb_called != 1) goto LAB_0016d3b2;
    if (close_cb_called != 2) goto LAB_0016d3b7;
    pcStack_d28 = (code *)0x16d33a;
    printf("output from stdio[3] is: %s",output);
    if (CONCAT17(output[0xe],
                 CONCAT16(output[0xd],
                          CONCAT15(output[0xc],
                                   CONCAT14(output[0xb],
                                            CONCAT13(output[10],
                                                     CONCAT12(output[9],
                                                              CONCAT11(output[8],output[7]))))))) !=
        0xa216f69647473 ||
        CONCAT17(output[7],
                 CONCAT16(output[6],
                          CONCAT15(output[5],
                                   CONCAT14(output[4],
                                            CONCAT13(output[3],
                                                     CONCAT12(output[2],
                                                              CONCAT11(output[1],output[0]))))))) !=
        0x7320687472756f66) goto LAB_0016d3bc;
    pcStack_d28 = (code *)0x16d366;
    puVar7 = (undefined1 *)uv_default_loop();
    pcStack_d28 = (code *)0x16d37a;
    uv_walk(puVar7,close_walk_cb,0);
    pcStack_d28 = (code *)0x16d384;
    uv_run(puVar7,0);
    pcStack_d28 = (code *)0x16d389;
    uVar5 = uv_default_loop();
    pcStack_d28 = (code *)0x16d391;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_d28 = (code *)0x16d3a8;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_0016d3a8:
    pcStack_d28 = (code *)0x16d3ad;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_0016d3ad:
    pcStack_d28 = (code *)0x16d3b2;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_0016d3b2:
    pcStack_d28 = (code *)0x16d3b7;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_0016d3b7:
    pcStack_d28 = (code *)0x16d3bc;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_0016d3bc:
    pcStack_d28 = (code *)0x16d3c1;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  pcStack_d28 = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  pcStack_e20 = (code *)0x16d3d2;
  uVar5 = uv_default_loop();
  pcStack_e20 = (code *)0x16d3dd;
  iVar2 = uv_tcp_init(uVar5,auStack_e18);
  if (iVar2 == 0) {
    pcStack_e20 = (code *)0x16d3ee;
    iVar2 = uv_tcp_open(auStack_e18,3);
    if (iVar2 != 0) goto LAB_0016d417;
    pcStack_e20 = (code *)0x16d401;
    iVar2 = uv_listen(auStack_e18,0x1000,0);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    pcStack_e20 = (code *)0x16d417;
    spawn_tcp_server_helper_cold_1();
LAB_0016d417:
    pcStack_e20 = (code *)0x16d41c;
    spawn_tcp_server_helper_cold_2();
  }
  pcStack_e20 = run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  pcStack_e20 = (code *)puVar7;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_e70);
  if (iVar2 == 0) {
    iStack_e74 = -1;
    uVar5 = uv_default_loop();
    iVar2 = uv_tcp_init_ex(uVar5,&tcp_server,2);
    if (iVar2 != 0) goto LAB_0016d582;
    iVar2 = uv_tcp_bind(&tcp_server,auStack_e70,0);
    if (iVar2 != 0) goto LAB_0016d587;
    iVar2 = uv_fileno(&tcp_server,&iStack_e74);
    if (iVar2 != 0) goto LAB_0016d58c;
    if (iStack_e74 < 1) goto LAB_0016d591;
    options.stdio = &uStack_e60;
    uStack_e60.flags = UV_INHERIT_FD;
    uStack_e60.data.fd = 0;
    uStack_e50 = 2;
    uStack_e48 = 1;
    uStack_e40 = 2;
    uStack_e38 = 2;
    uStack_e30 = 2;
    iStack_e28 = iStack_e74;
    options.stdio_count = 4;
    uVar5 = uv_default_loop();
    iVar2 = uv_spawn(uVar5,&process,&options);
    if (iVar2 != 0) goto LAB_0016d596;
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d59b;
    if (exit_cb_called != 1) goto LAB_0016d5a0;
    if (close_cb_called != 1) goto LAB_0016d5a5;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0016d582:
    run_test_spawn_tcp_server_cold_2();
LAB_0016d587:
    run_test_spawn_tcp_server_cold_3();
LAB_0016d58c:
    run_test_spawn_tcp_server_cold_4();
LAB_0016d591:
    run_test_spawn_tcp_server_cold_5();
LAB_0016d596:
    run_test_spawn_tcp_server_cold_6();
LAB_0016d59b:
    run_test_spawn_tcp_server_cold_7();
LAB_0016d5a0:
    run_test_spawn_tcp_server_cold_8();
LAB_0016d5a5:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar5 = uv_default_loop();
  iVar2 = uv_spawn(uVar5,&process,&options);
  if (iVar2 == 0) {
    uVar5 = uv_default_loop();
    iVar2 = uv_run(uVar5,0);
    if (iVar2 != 0) goto LAB_0016d65c;
    if (exit_cb_called != 1) goto LAB_0016d661;
    if (close_cb_called != 1) goto LAB_0016d666;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    uv_run(uVar5,0);
    uVar5 = uv_default_loop();
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0016d65c:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0016d661:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0016d666:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar8 = (uv_timer_t *)uv_default_loop();
  puVar11 = &process;
  iVar2 = uv_spawn(puVar8,&process,&options);
  if (iVar2 == 0) {
    puVar8 = (uv_timer_t *)uv_default_loop();
    puVar12 = &timer;
    iVar2 = uv_timer_init();
    pcVar13 = (code *)puVar12;
    if (iVar2 != 0) goto LAB_0016d743;
    puVar8 = &timer;
    pcVar13 = timer_cb;
    iVar2 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar2 != 0) goto LAB_0016d748;
    puVar8 = (uv_timer_t *)uv_default_loop();
    pcVar13 = (code *)0x0;
    iVar2 = uv_run();
    if (iVar2 != 0) goto LAB_0016d74d;
    if (exit_cb_called != 1) goto LAB_0016d752;
    if (close_cb_called != 2) goto LAB_0016d757;
    uVar5 = uv_default_loop();
    uv_walk(uVar5,close_walk_cb,0);
    pcVar13 = (code *)0x0;
    uv_run(uVar5);
    puVar8 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar13 = (code *)puVar11;
LAB_0016d743:
    run_test_spawn_and_kill_cold_2();
LAB_0016d748:
    run_test_spawn_and_kill_cold_3();
LAB_0016d74d:
    run_test_spawn_and_kill_cold_4();
LAB_0016d752:
    run_test_spawn_and_kill_cold_5();
LAB_0016d757:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar9 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar13 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar8,close_cb);
      pcVar9 = (char *)(ulong)*(uint *)puVar8->heap_node;
      iVar2 = uv_kill(pcVar9,0);
      if (iVar2 == -3) {
        return;
      }
      goto LAB_0016d7b6;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0016d7b6:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(pcVar9,close_cb);
  return;
}

Assistant:

static void on_read(uv_stream_t* handle,
                    ssize_t nread,
                    const uv_buf_t* buf) {
  int r;
  uv_pipe_t* pipe;
  uv_handle_type pending;
  uv_buf_t outbuf;

  pipe = (uv_pipe_t*) handle;

  if (nread == 0) {
    /* Everything OK, but nothing read. */
    free(buf->base);
    return;
  }

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on channel: %s\n", uv_strerror(nread));
    abort();
  }

  fprintf(stderr, "got %d bytes\n", (int)nread);

  pending = uv_pipe_pending_type(pipe);
  if (!tcp_server_listening) {
    ASSERT(1 == uv_pipe_pending_count(pipe));
    ASSERT(nread > 0 && buf->base && pending != UV_UNKNOWN_HANDLE);
    read_cb_called++;

    /* Accept the pending TCP server, and start listening on it. */
    ASSERT(pending == UV_TCP);
    r = uv_tcp_init(uv_default_loop(), &tcp_server);
    ASSERT(r == 0);

    r = uv_accept((uv_stream_t*)pipe, (uv_stream_t*)&tcp_server);
    ASSERT(r == 0);

    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, on_connection);
    ASSERT(r == 0);

    tcp_server_listening = 1;

    /* Make sure that the expected data is correctly multiplexed. */
    ASSERT(memcmp("hello\n", buf->base, nread) == 0);

    outbuf = uv_buf_init("world\n", 6);
    r = uv_write(&write_req, (uv_stream_t*)pipe, &outbuf, 1, NULL);
    ASSERT(r == 0);

    /* Create a bunch of connections to get both servers to accept. */
    make_many_connections();
  } else if (memcmp("accepted_connection\n", buf->base, nread) == 0) {
    /* Remote server has accepted a connection.  Close the channel. */
    ASSERT(0 == uv_pipe_pending_count(pipe));
    ASSERT(pending == UV_UNKNOWN_HANDLE);
    remote_conn_accepted = 1;
    uv_close((uv_handle_t*)&channel, NULL);
  }

  free(buf->base);
}